

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_cache.cpp
# Opt level: O0

char * libtorrent::job_name(job_action_t job)

{
  uint uVar1;
  const_reference ppcVar2;
  const_reference ppcVar3;
  int j;
  job_action_t job_local;
  
  uVar1 = (uint)job;
  if (uVar1 < 0x16) {
    if (uVar1 < 0xf) {
      ppcVar2 = std::array<const_char_*,_15UL>::operator[]
                          ((array<const_char_*,_15UL> *)job_action_name,(long)(int)uVar1);
      _j = *ppcVar2;
    }
    else {
      ppcVar3 = std::array<const_char_*,_7UL>::operator[]
                          ((array<const_char_*,_7UL> *)piece_log_t::job_names,
                           (long)(int)(uVar1 - 0xf));
      _j = *ppcVar3;
    }
  }
  else {
    _j = "unknown";
  }
  return _j;
}

Assistant:

char const* job_name(job_action_t const job)
	{
		int const j = static_cast<int>(job);
		if (j < 0 || j >= piece_log_t::last_job)
			return "unknown";

		if (j < piece_log_t::flushing)
			return job_action_name[static_cast<std::size_t>(j)];
		return piece_log_t::job_names[static_cast<std::size_t>(j - piece_log_t::flushing)];
	}